

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  undefined1 local_a8 [24];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  InternalKey end_storage;
  InternalKey begin_storage;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x255,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if ((uint)level < 6) {
    begin_storage.rep_._M_dataplus._M_p = (pointer)&begin_storage.rep_.field_2;
    begin_storage.rep_._M_string_length = 0;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    end_storage.rep_._M_dataplus._M_p = (pointer)&end_storage.rep_.field_2;
    end_storage.rep_._M_string_length = 0;
    begin_storage.rep_.field_2._M_local_buf[0] = '\0';
    end_storage.rep_.field_2._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_a8[4] = false;
    local_a8._0_4_ = level;
    if (begin != (Slice *)0x0) {
      InternalKey::InternalKey((InternalKey *)&bStack_c8,begin,0xffffffffffffff,kTypeValue);
      pbVar2 = &begin_storage.rep_;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (pbVar2,&bStack_c8);
      std::__cxx11::string::~string((string *)&bStack_c8);
    }
    local_a8._8_8_ = pbVar2;
    if (end == (Slice *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      InternalKey::InternalKey((InternalKey *)&bStack_c8,end,0,kTypeDeletion);
      pbVar2 = &end_storage.rep_;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (pbVar2,&bStack_c8);
      std::__cxx11::string::~string((string *)&bStack_c8);
    }
    local_a8._16_8_ = pbVar2;
    std::mutex::lock(&(this->mutex_).mu_);
    while (((local_a8[4] == false && (((this->shutting_down_)._M_base._M_i & 1U) == 0)) &&
           ((this->bg_error_).state_ == (char *)0x0))) {
      if (this->manual_compaction_ == (ManualCompaction *)0x0) {
        this->manual_compaction_ = (ManualCompaction *)local_a8;
        MaybeScheduleCompaction(this);
      }
      else {
        port::CondVar::Wait(&this->background_work_finished_signal_);
      }
    }
    if (this->manual_compaction_ == (ManualCompaction *)local_a8) {
      this->manual_compaction_ = (ManualCompaction *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&end_storage);
    std::__cxx11::string::~string((string *)&begin_storage);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("level + 1 < config::kNumLevels",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                ,0x256,"void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)")
  ;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}